

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

ChebyshevExpansion *
ChebTools::ChebyshevExpansion::factoryfFFT
          (ChebyshevExpansion *__return_storage_ptr__,size_t N,VectorXd *f,double xmin,double xmax)

{
  Index *this;
  double other;
  undefined1 *puVar1;
  invalid_argument *this_00;
  Index IVar2;
  Scalar *pSVar3;
  vectype local_3c0;
  NonConstRealReturnType local_3a8;
  Type local_398;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_358;
  undefined1 local_2f8 [8];
  ArrayXd ChebCoeffs;
  Index n;
  undefined1 local_2d8 [8];
  VectorXcd FourierCoeffs;
  undefined1 local_238 [8];
  FFT<double,_Eigen::default_fft_impl<double>_> fft;
  Nested local_168;
  Type local_160;
  Type local_138;
  long local_100;
  undefined1 local_f8 [8];
  VectorXd valsUnitDisc;
  string local_e0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  double local_30;
  double xmax_local;
  double xmin_local;
  VectorXd *f_local;
  size_t N_local;
  
  local_30 = xmax;
  xmax_local = xmin;
  xmin_local = (double)f;
  f_local = (VectorXd *)N;
  N_local = (size_t)__return_storage_ptr__;
  puVar1 = (undefined1 *)
           Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                     ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)f);
  if (puVar1 != (undefined1 *)
                ((long)&(f_local->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data + 1)) {
    valsUnitDisc.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
    _7_1_ = 1;
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                      ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xmin_local);
    std::__cxx11::to_string(&local_b0,IVar2);
    std::operator+(&local_90,"Size of f [",&local_b0);
    std::operator+(&local_70,&local_90,"] does not equal N+1 with N of ");
    std::__cxx11::to_string(&local_e0,(unsigned_long)f_local);
    std::operator+(&local_50,&local_70,&local_e0);
    std::invalid_argument::invalid_argument(this_00,(string *)&local_50);
    valsUnitDisc.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
    _7_1_ = 0;
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xmin_local);
  local_100 = IVar2 * 2 + -2;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_f8,&local_100);
  other = xmin_local;
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xmin_local);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<long>
            (&local_138,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_f8,IVar2);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_138,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)other);
  local_168 = (Nested)Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::reverse
                                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xmin_local);
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xmin_local);
  Eigen::DenseBase<Eigen::Reverse<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2>_>::segment<long>
            (&local_160,
             (DenseBase<Eigen::Reverse<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2>_> *)
             &local_168,1,IVar2 + -2);
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xmin_local);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<long>
            ((Type *)&fft.m_flag,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_f8,
             IVar2 + -2);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&fft.m_flag,
             (DenseBase<Eigen::Block<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2>,__1,_1,_false>_>
              *)&local_160);
  FourierCoeffs.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  this = &FourierCoeffs.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>
          .m_storage.m_rows;
  Eigen::default_fft_impl<double>::default_fft_impl((default_fft_impl<double> *)this);
  Eigen::FFT<double,_Eigen::default_fft_impl<double>_>::FFT
            ((FFT<double,_Eigen::default_fft_impl<double>_> *)local_238,(impl_type *)this,Default);
  Eigen::default_fft_impl<double>::~default_fft_impl
            ((default_fft_impl<double> *)
             &FourierCoeffs.
              super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage
              .m_rows);
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xmin_local);
  n = IVar2 * 2 + -2;
  Eigen::Matrix<std::complex<double>,_-1,_1,_0,_-1,_1>::Matrix<long>
            ((Matrix<std::complex<double>,__1,_1,_0,__1,_1> *)local_2d8,&n);
  Eigen::FFT<double,Eigen::default_fft_impl<double>>::
  fwd<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<std::complex<double>,_1,1,0,_1,1>>
            ((FFT<double,Eigen::default_fft_impl<double>> *)local_238,
             (MatrixBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *)local_2d8,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_f8,-1);
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xmin_local);
  ChebCoeffs.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       IVar2 + -1;
  Eigen::DenseBase<Eigen::Matrix<std::complex<double>,_-1,_1,_0,_-1,_1>_>::real
            (&local_3a8,
             (DenseBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *)local_2d8);
  Eigen::
  DenseBase<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_-1,_1,_0,_-1,_1>_>_>
  ::head<long>(&local_398,
               (DenseBase<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>_>
                *)&local_3a8,
               ChebCoeffs.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows + 1);
  Eigen::
  MatrixBase<Eigen::Block<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>,Eigen::Matrix<std::complex<double>,-1,1,0,-1,1>>,-1,1,false>>
  ::operator/(&local_358,
              (MatrixBase<Eigen::Block<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>,Eigen::Matrix<std::complex<double>,_1,1,0,_1,1>>,_1,1,false>>
               *)&local_398,
              &ChebCoeffs.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows);
  Eigen::Array<double,-1,1,0,-1,1>::
  Array<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>,Eigen::Matrix<std::complex<double>,_1,1,0,_1,1>>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((Array<double,_1,1,0,_1,1> *)local_2f8,&local_358);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)local_2f8,0);
  *pSVar3 = *pSVar3 * 0.5;
  IVar2 = Eigen::EigenBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)local_2f8);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)local_2f8,
                      IVar2 + -1);
  *pSVar3 = *pSVar3 * 0.5;
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Array<double,_1,1,0,_1,1>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_3c0,
             (EigenBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)local_2f8);
  ChebyshevExpansion(__return_storage_ptr__,&local_3c0,xmax_local,local_30);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_3c0);
  Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array((Array<double,__1,_1,_0,__1,_1> *)local_2f8);
  Eigen::Matrix<std::complex<double>,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<std::complex<double>,__1,_1,_0,__1,_1> *)local_2d8);
  Eigen::FFT<double,_Eigen::default_fft_impl<double>_>::~FFT
            ((FFT<double,_Eigen::default_fft_impl<double>_> *)local_238);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_f8);
  return __return_storage_ptr__;
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::factoryfFFT(const std::size_t N, const Eigen::VectorXd& f, const double xmin, const double xmax) {
        if (f.size() != N+1){
            throw std::invalid_argument("Size of f [" + std::to_string(f.size()) + "] does not equal N+1 with N of "+std::to_string(N));
        }
        Eigen::VectorXd valsUnitDisc(2 * f.size() - 2);
        // Starting at x = 1, going to -1, then the same nodes, not including x=-1 and x=1, in the opposite order
        valsUnitDisc.head(f.size()) = f;
        valsUnitDisc.tail(f.size() - 2) = f.reverse().segment(1, f.size() - 2);
        
        Eigen::FFT<double> fft;
        Eigen::VectorXcd FourierCoeffs(2 * f.size() - 2);
        fft.fwd(FourierCoeffs, valsUnitDisc);
        auto n = f.size() - 1;
        Eigen::ArrayXd ChebCoeffs = FourierCoeffs.real().head(n+1)/n;
        ChebCoeffs[0] /= 2;
        ChebCoeffs[ChebCoeffs.size()-1] /= 2;

        return ChebyshevExpansion(ChebCoeffs, xmin, xmax);
    }